

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O2

bool __thiscall pg::DTLSolver::sptl(DTLSolver *this,bitset *V,bitset *W,bitset *R,int player)

{
  ulong *puVar1;
  uint uVar2;
  Game *pGVar3;
  size_t sVar4;
  uint64_t *puVar5;
  byte bVar6;
  bool bVar7;
  uint vertex;
  int iVar8;
  ostream *poVar9;
  int *piVar10;
  bool bVar11;
  ulong uVar12;
  long lVar13;
  uint i;
  ulong uVar14;
  bitset *R_00;
  _label_vertex local_70;
  bitset *local_60;
  bitset *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  bitset *local_38;
  
  R_00 = &this->Z;
  bVar11 = false;
  local_40 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
  local_60 = W;
  local_58 = V;
  local_38 = R_00;
  do {
    vertex = (int)local_40 - 1;
    uVar12 = (ulong)vertex;
    if ((int)vertex < 0) {
      return bVar11;
    }
    local_48 = (ulong)(vertex >> 6);
    if (((V->_bits[local_48] >> (uVar12 & 0x3f) & 1) != 0) &&
       (local_50 = 1L << (uVar12 & 0x3f), (R->_bits[local_48] & local_50) != 0)) {
      puVar1 = (this->Z)._bits + local_48;
      *puVar1 = *puVar1 | local_50;
      this->str[uVar12] = -1;
      iVar8 = (this->Q).pointer;
      (this->Q).pointer = iVar8 + 1;
      (this->Q).queue[iVar8] = vertex;
      while( true ) {
        iVar8 = (this->Q).pointer;
        if ((long)iVar8 == 0) break;
        (this->Q).pointer = iVar8 + -1;
        uVar2 = (this->Q).queue[(long)iVar8 + -1];
        bVar6 = (byte)uVar2 & 0x3f;
        R->_bits[(ulong)(long)(int)uVar2 >> 6] =
             R->_bits[(ulong)(long)(int)uVar2 >> 6] &
             (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        if (1 < (this->super_Solver).trace) {
          iVar8 = (this->Zvec).pointer;
          (this->Zvec).pointer = iVar8 + 1;
          (this->Zvec).queue[iVar8] = uVar2;
        }
        attractVertices(this,player,uVar2,R,R_00,R,((this->super_Solver).game)->_priority[uVar12]);
        attractTangles(this,player,uVar2,R,R_00,R,((this->super_Solver).game)->_priority[uVar12]);
      }
      if (1 < (this->super_Solver).trace) {
        poVar9 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m \x1b[1;36m");
        poVar9 = (ostream *)
                 std::ostream::operator<<(poVar9,((this->super_Solver).game)->_priority[uVar12]);
        std::operator<<(poVar9,"\x1b[m");
        for (uVar14 = 0; uVar14 < (uint)(this->Zvec).pointer; uVar14 = uVar14 + 1) {
          uVar2 = (this->Zvec).queue[uVar14];
          poVar9 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
          local_70.g = (this->super_Solver).game;
          local_70.v = uVar2;
          poVar9 = operator<<(poVar9,&local_70);
          std::operator<<(poVar9,"\x1b[m");
          if (this->str[(int)uVar2] != -1) {
            poVar9 = std::operator<<((this->super_Solver).logger,"->");
            local_70.g = (this->super_Solver).game;
            local_70.v = this->str[(int)uVar2];
            operator<<(poVar9,&local_70);
          }
          R_00 = local_38;
        }
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        (this->Zvec).pointer = 0;
      }
      iVar8 = Solver::owner(&this->super_Solver,vertex);
      if (iVar8 == player) {
        if (this->str[uVar12] != -1) {
LAB_0016bc4d:
          uVar12 = local_60->_bits[local_48];
          if ((uVar12 & local_50) == 0) {
            local_60->_bits[local_48] = uVar12 | local_50;
            memset(this->pea_vidx,0,((this->super_Solver).game)->n_vertices << 2);
            this->pea_curidx = 1;
            bVar7 = extractTangles(this,vertex,R_00,this->str);
            bVar11 = (bool)(bVar11 | bVar7);
          }
        }
      }
      else {
        pGVar3 = (this->super_Solver).game;
        piVar10 = pGVar3->_outedges + pGVar3->_firstouts[uVar12];
        do {
          uVar12 = (ulong)*piVar10;
          if (uVar12 == 0xffffffffffffffff) goto LAB_0016bc4d;
          piVar10 = piVar10 + 1;
        } while ((R->_bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0);
      }
      sVar4 = (this->Z)._bitssize;
      puVar5 = (this->Z)._bits;
      for (lVar13 = 0; V = local_58, sVar4 << 3 != lVar13; lVar13 = lVar13 + 8) {
        *(undefined8 *)((long)puVar5 + lVar13) = 0;
      }
    }
    local_40 = local_40 - 1;
  } while( true );
}

Assistant:

bool
DTLSolver::sptl(bitset &V, bitset &W, bitset &R, const int player)
{
    bool changes = false;

    for (int top=nodecount()-1; top>=0; top--) {
        if (!V[top] or !R[top]) continue; // meh

        Z[top] = true; // add to <Z>
        str[top] = -1;
        Q.push(top);

        while (Q.nonempty()) {
            const int v = Q.pop();
            R[v] = false; // remove from <R>
#ifndef NDEBUG
            if (trace >= 2) Zvec.push(v);
#endif
            attractVertices(player, v, R, Z, R, priority(top));
            attractTangles(player, v, R, Z, R, priority(top));
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m \033[1;36m" << priority(top) << "\033[m";
            for (unsigned int i=0; i<Zvec.size(); i++) {
                int v = Zvec[i];
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
            Zvec.clear();
        }
#endif

        bool closed_region = true;

        if (owner(top) == player) {
            if (str[top] == -1) {
                closed_region = false;
            }
        } else {
            for (auto curedge = outs(top); *curedge != -1; curedge++) {
                int to = *curedge;
                if (R[to]) {
                    closed_region = false;
                    break;
                }
            }
        }

        if (closed_region and !W[top]) {
            W[top] = true;

            /**
             * Extract tangles by computing SCCs starting at each top vertex.
             * Note: each bottom SCC must contain a head vertex.
             */

            memset(pea_vidx, 0, sizeof(int[nodecount()]));
            pea_curidx = 1;

            if (extractTangles(top, Z, str)) changes = true;
        }

        Z.reset();
    }

    return changes;
}